

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

cTValue * lj_meta_tget(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  bool bVar2;
  cTValue *pcVar3;
  ulong uVar4;
  int iVar5;
  TValue *pTVar6;
  cTValue *unaff_R14;
  cTValue *unaff_R15;
  GCtab *t;
  
  iVar5 = 100;
  do {
    if ((o->field_2).it == 0xfffffff4) {
      uVar1 = (o->u32).lo;
      pcVar3 = lj_tab_get(L,(GCtab *)(ulong)uVar1,k);
      if ((pcVar3->field_2).it == 0xffffffff) {
        t = (GCtab *)(ulong)(((GCtab *)(ulong)uVar1)->metatable).gcptr32;
        if ((t == (GCtab *)0x0) || ((t->nomm & 1) != 0)) {
LAB_00116dcb:
          unaff_R14 = (cTValue *)0x0;
        }
        else {
          unaff_R14 = lj_tab_getstr(t,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x198));
          if ((unaff_R14 == (cTValue *)0x0) || ((unaff_R14->field_2).it == 0xffffffff)) {
            t->nomm = t->nomm | 1;
            goto LAB_00116dcb;
          }
        }
        if (unaff_R14 == (cTValue *)0x0) {
          unaff_R14 = (cTValue *)0x0;
          goto LAB_00116d92;
        }
        bVar2 = true;
      }
      else {
LAB_00116d92:
        bVar2 = false;
        unaff_R15 = pcVar3;
      }
      if (bVar2) goto LAB_00116de7;
      bVar2 = false;
      pcVar3 = o;
    }
    else {
      unaff_R14 = lj_meta_lookup(L,o,MM_index);
      if ((unaff_R14->field_2).it == 0xffffffff) {
        lj_err_optype(L,o,LJ_ERR_OPINDEX);
      }
LAB_00116de7:
      bVar2 = true;
      pcVar3 = unaff_R14;
      if ((unaff_R14->field_2).it == 0xfffffff7) {
        uVar4 = (ulong)L->base[-1].u32.lo;
        if (*(char *)(uVar4 + 6) == '\0') {
          pTVar6 = L->base + *(byte *)((ulong)*(uint *)(uVar4 + 0x10) - 0x39);
        }
        else {
          pTVar6 = L->top;
        }
        pTVar6->n = 3.90756519295842e-320;
        pTVar6[1] = *unaff_R14;
        pTVar6[2] = *o;
        pTVar6[3] = *k;
        L->top = pTVar6 + 2;
        unaff_R15 = (cTValue *)0x0;
        bVar2 = false;
        pcVar3 = o;
      }
    }
    if (!bVar2) {
      return unaff_R15;
    }
    iVar5 = iVar5 + -1;
    o = pcVar3;
    if (iVar5 == 0) {
      lj_err_msg(L,LJ_ERR_GETLOOP);
    }
  } while( true );
}

Assistant:

cTValue *lj_meta_tget(lua_State *L, cTValue *o, cTValue *k)
{
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (!tvisnil(tv) ||
	  !(mo = lj_meta_fast(L, tabref(t->metatable), MM_index)))
	return tv;
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_index))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_ra, mo, o, k);
      return NULL;  /* Trigger metamethod call. */
    }
    o = mo;
  }
  lj_err_msg(L, LJ_ERR_GETLOOP);
  return NULL;  /* unreachable */
}